

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

LinkImplementation * __thiscall cmTarget::GetLinkImplementation(cmTarget *this,string *config)

{
  cmTargetInternals *this_00;
  mapped_type *impl;
  string CONFIG;
  cmTarget *local_40;
  string local_38;
  
  if (this->IsImportedTarget == false) {
    cmsys::SystemTools::UpperCase(&local_38,config);
    this_00 = (cmTargetInternals *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkImplementationMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkImplementationMap>_>_>
              ::operator[](&((this->Internal).Pointer)->LinkImplMap,&local_38);
    local_40 = this;
    impl = std::
           map<const_cmTarget_*,_cmTargetInternals::OptionalLinkImplementation,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkImplementation>_>_>
           ::operator[]((map<const_cmTarget_*,_cmTargetInternals::OptionalLinkImplementation,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkImplementation>_>_>
                         *)this_00,&local_40);
    if (impl->LibrariesDone == false) {
      impl->LibrariesDone = true;
      this_00 = (this->Internal).Pointer;
      cmTargetInternals::ComputeLinkImplementationLibraries(this_00,this,config,impl,this);
    }
    if (impl->LanguagesDone == false) {
      impl->LanguagesDone = true;
      cmTargetInternals::ComputeLinkImplementationLanguages(this_00,this,config,impl);
    }
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    impl = (mapped_type *)0x0;
  }
  return &impl->super_LinkImplementation;
}

Assistant:

cmTarget::LinkImplementation const*
cmTarget::GetLinkImplementation(const std::string& config) const
{
  // There is no link implementation for imported targets.
  if(this->IsImported())
    {
    return 0;
    }

  // Populate the link implementation for this configuration.
  std::string CONFIG = cmSystemTools::UpperCase(config);
  cmTargetInternals::OptionalLinkImplementation&
    impl = this->Internal->LinkImplMap[CONFIG][this];
  if(!impl.LibrariesDone)
    {
    impl.LibrariesDone = true;
    this->Internal
      ->ComputeLinkImplementationLibraries(this, config, impl, this);
    }
  if(!impl.LanguagesDone)
    {
    impl.LanguagesDone = true;
    this->Internal->ComputeLinkImplementationLanguages(this, config, impl);
    }
  return &impl;
}